

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

size_t plot::utf8_string_width<char_const*>(char *first,char *last)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  byte *pbVar4;
  uint uVar5;
  long lVar6;
  uint *puVar7;
  uint uVar8;
  bool bVar9;
  
  if (first == last) {
    return 0;
  }
  sVar2 = 0;
  do {
    bVar1 = *first;
    uVar8 = 1;
    if ((((char)bVar1 < '\0') && (uVar8 = 2, (bVar1 & 0xe0) != 0xc0)) &&
       (uVar8 = 3, (bVar1 & 0xf0) != 0xe0)) {
      uVar8 = (uint)((bVar1 & 0xf8) == 0xf0) << 2;
    }
    if (uVar8 == 0) {
      uVar5 = 0xffffffff;
    }
    else {
      uVar5 = (uint)(*(byte *)((long)&detail::utf8_start_masks + (ulong)uVar8) & bVar1);
      if (1 < (int)(uVar8 - 1)) {
        do {
          uVar5 = uVar5 << 6;
          uVar8 = uVar8 - 1;
        } while (2 < (int)uVar8);
      }
    }
    bVar9 = true;
    puVar7 = &detail::unicode_tables<void>::zero_width;
    do {
      if ((puVar7[1] <= uVar5) && (uVar5 <= puVar7[2])) break;
      puVar7 = *(uint **)(puVar7 + (ulong)(*puVar7 <= uVar5) * 2 + 4);
      bVar9 = puVar7 != (uint *)0x0;
    } while (bVar9);
    if (bVar9) {
      lVar6 = 0;
    }
    else {
      uVar3 = 1;
      puVar7 = &detail::unicode_tables<void>::double_width;
      do {
        if ((puVar7[1] <= uVar5) && (uVar5 <= puVar7[2])) break;
        puVar7 = *(uint **)(puVar7 + (ulong)(*puVar7 <= uVar5) * 2 + 4);
        uVar3 = (ulong)(puVar7 != (uint *)0x0);
      } while (puVar7 != (uint *)0x0);
      lVar6 = uVar3 + 1;
    }
    sVar2 = sVar2 + lVar6;
    pbVar4 = (byte *)first;
    while (first = last, pbVar4 != (byte *)last) {
      bVar1 = pbVar4[1];
      first = (char *)(pbVar4 + 1);
      if (((((bVar1 & 0xf8) == 0xf0) || ((bVar1 & 0xf0) == 0xe0)) || (-1 < (char)bVar1)) ||
         (pbVar4 = (byte *)first, (bVar1 & 0xe0) == 0xc0)) break;
    }
    if (first == last) {
      return sVar2;
    }
  } while( true );
}

Assistant:

std::size_t utf8_string_width(Iterator first, Iterator last) {
    std::size_t width = 0;

    for (; first != last; first = detail::utf8_next(first, last))
        width += detail::wcwidth(detail::utf8_cp(first, last));

    return width;
}